

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__process_marker(stbi__jpeg *z,int m)

{
  stbi__context *psVar1;
  byte *pbVar2;
  stbi_uc *psVar3;
  uchar *puVar4;
  byte bVar5;
  stbi_uc sVar6;
  sbyte sVar7;
  uchar uVar8;
  byte bVar9;
  ushort uVar10;
  uint uVar11;
  stbi_uc *psVar13;
  int i_1;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  byte bVar19;
  int ok;
  bool bVar20;
  int sizes [16];
  uint local_78 [18];
  int iVar12;
  
  if (m < 0xdd) {
    if (m == 0xc4) {
      uVar11 = stbi__get16be(z->s);
      iVar18 = uVar11 - 2;
      if (2 < uVar11) {
        do {
          psVar1 = z->s;
          pbVar2 = psVar1->img_buffer;
          if (pbVar2 < psVar1->img_buffer_end) {
            psVar1->img_buffer = pbVar2 + 1;
            bVar9 = *pbVar2;
          }
          else if (psVar1->read_from_callbacks == 0) {
            bVar9 = 0;
          }
          else {
            psVar3 = psVar1->buffer_start;
            iVar12 = (*(psVar1->io).read)(psVar1->io_user_data,(char *)psVar3,psVar1->buflen);
            if (iVar12 == 0) {
              psVar1->read_from_callbacks = 0;
              psVar13 = psVar1->buffer_start + 1;
              psVar1->buffer_start[0] = '\0';
              bVar9 = 0;
            }
            else {
              psVar13 = psVar3 + iVar12;
              bVar9 = *psVar3;
            }
            psVar1->img_buffer_end = psVar13;
            psVar1->img_buffer = psVar1->buffer_start + 1;
          }
          if ((0x1f < bVar9) || (bVar19 = bVar9 & 0xf, 3 < bVar19)) {
            stbi__g_failure_reason = "bad DHT header";
            goto LAB_0012a734;
          }
          lVar14 = 0;
          uVar11 = 0;
          do {
            psVar1 = z->s;
            pbVar2 = psVar1->img_buffer;
            if (pbVar2 < psVar1->img_buffer_end) {
              psVar1->img_buffer = pbVar2 + 1;
              bVar5 = *pbVar2;
            }
            else if (psVar1->read_from_callbacks == 0) {
              bVar5 = 0;
            }
            else {
              psVar3 = psVar1->buffer_start;
              iVar12 = (*(psVar1->io).read)(psVar1->io_user_data,(char *)psVar3,psVar1->buflen);
              if (iVar12 == 0) {
                psVar1->read_from_callbacks = 0;
                psVar13 = psVar1->buffer_start + 1;
                psVar1->buffer_start[0] = '\0';
                bVar5 = 0;
              }
              else {
                psVar13 = psVar3 + iVar12;
                bVar5 = *psVar3;
              }
              psVar1->img_buffer_end = psVar13;
              psVar1->img_buffer = psVar1->buffer_start + 1;
            }
            local_78[lVar14] = (uint)bVar5;
            uVar11 = uVar11 + bVar5;
            lVar14 = lVar14 + 1;
          } while (lVar14 != 0x10);
          if (bVar9 < 0x10) {
            iVar12 = stbi__build_huffman(z->huff_dc + bVar19,(int *)local_78);
            lVar14 = 8;
          }
          else {
            iVar12 = stbi__build_huffman(z->huff_ac + bVar19,(int *)local_78);
            lVar14 = 0x1a48;
          }
          if (iVar12 == 0) goto LAB_0012a734;
          if (uVar11 != 0) {
            uVar15 = 0;
            do {
              psVar1 = z->s;
              psVar3 = psVar1->img_buffer;
              if (psVar3 < psVar1->img_buffer_end) {
                psVar1->img_buffer = psVar3 + 1;
                sVar6 = *psVar3;
              }
              else if (psVar1->read_from_callbacks == 0) {
                sVar6 = '\0';
              }
              else {
                psVar3 = psVar1->buffer_start;
                iVar12 = (*(psVar1->io).read)(psVar1->io_user_data,(char *)psVar3,psVar1->buflen);
                if (iVar12 == 0) {
                  psVar1->read_from_callbacks = 0;
                  psVar13 = psVar1->buffer_start + 1;
                  psVar1->buffer_start[0] = '\0';
                  sVar6 = '\0';
                }
                else {
                  psVar13 = psVar3 + iVar12;
                  sVar6 = *psVar3;
                }
                psVar1->img_buffer_end = psVar13;
                psVar1->img_buffer = psVar1->buffer_start + 1;
              }
              z->huff_dc[bVar19].values[uVar15 + lVar14 + -8] = sVar6;
              uVar15 = uVar15 + 1;
            } while (uVar11 != uVar15);
          }
          if (0xf < bVar9) {
            lVar14 = 0;
            do {
              uVar15 = (ulong)z->huff_ac[bVar19].fast[lVar14];
              z->fast_ac[bVar19][lVar14] = 0;
              if (uVar15 != 0xff) {
                bVar9 = z->huff_ac[bVar19].values[uVar15];
                if ((bVar9 & 0xf) != 0) {
                  bVar5 = z->huff_ac[bVar19].size[uVar15];
                  uVar10 = (bVar9 & 0xf) + (ushort)bVar5;
                  if (uVar10 < 10) {
                    uVar17 = (int)lVar14 << (bVar5 & 0x1f) & 0x1ff;
                    sVar7 = (sbyte)(bVar9 & 0xf);
                    uVar16 = -1 << sVar7 | 1;
                    if (0xff < uVar17) {
                      uVar16 = 0;
                    }
                    iVar12 = uVar16 + (uVar17 >> (9U - sVar7 & 0x1f));
                    if ((char)iVar12 == iVar12) {
                      z->fast_ac[bVar19][lVar14] = (short)iVar12 * 0x100 | bVar9 & 0xfff0 | uVar10;
                    }
                  }
                }
              }
              lVar14 = lVar14 + 1;
            } while (lVar14 != 0x200);
          }
          iVar18 = (iVar18 + -0x11) - uVar11;
        } while (0 < iVar18);
      }
    }
    else {
      if (m != 0xdb) {
LAB_0012a280:
        if (m == 0xfe || (m & 0xfffffff0U) == 0xe0) {
          uVar11 = stbi__get16be(z->s);
          if (1 < uVar11) {
            if (uVar11 < 7 || m != 0xe0) {
              if (uVar11 < 0xe || m != 0xee) {
                iVar18 = uVar11 - 2;
              }
              else {
                bVar20 = true;
                lVar14 = 0;
                do {
                  psVar1 = z->s;
                  puVar4 = psVar1->img_buffer;
                  if (puVar4 < psVar1->img_buffer_end) {
                    psVar1->img_buffer = puVar4 + 1;
                    uVar8 = *puVar4;
                  }
                  else if (psVar1->read_from_callbacks == 0) {
                    uVar8 = '\0';
                  }
                  else {
                    psVar3 = psVar1->buffer_start;
                    iVar18 = (*(psVar1->io).read)
                                       (psVar1->io_user_data,(char *)psVar3,psVar1->buflen);
                    if (iVar18 == 0) {
                      psVar1->read_from_callbacks = 0;
                      psVar13 = psVar1->buffer_start + 1;
                      psVar1->buffer_start[0] = '\0';
                      uVar8 = '\0';
                    }
                    else {
                      psVar13 = psVar3 + iVar18;
                      uVar8 = *psVar3;
                    }
                    psVar1->img_buffer_end = psVar13;
                    psVar1->img_buffer = psVar1->buffer_start + 1;
                  }
                  if (uVar8 != "Adobe"[lVar14]) {
                    bVar20 = false;
                  }
                  lVar14 = lVar14 + 1;
                } while (lVar14 != 6);
                if (bVar20) {
                  stbi__get8(z->s);
                  stbi__get16be(z->s);
                  stbi__get16be(z->s);
                  bVar9 = stbi__get8(z->s);
                  z->app14_color_transform = (uint)bVar9;
                  iVar18 = uVar11 - 0xe;
                }
                else {
                  iVar18 = uVar11 - 8;
                }
              }
            }
            else {
              bVar20 = true;
              lVar14 = 0;
              do {
                psVar1 = z->s;
                puVar4 = psVar1->img_buffer;
                if (puVar4 < psVar1->img_buffer_end) {
                  psVar1->img_buffer = puVar4 + 1;
                  uVar8 = *puVar4;
                }
                else if (psVar1->read_from_callbacks == 0) {
                  uVar8 = '\0';
                }
                else {
                  psVar3 = psVar1->buffer_start;
                  iVar18 = (*(psVar1->io).read)(psVar1->io_user_data,(char *)psVar3,psVar1->buflen);
                  if (iVar18 == 0) {
                    psVar1->read_from_callbacks = 0;
                    psVar13 = psVar1->buffer_start + 1;
                    psVar1->buffer_start[0] = '\0';
                    uVar8 = '\0';
                  }
                  else {
                    psVar13 = psVar3 + iVar18;
                    uVar8 = *psVar3;
                  }
                  psVar1->img_buffer_end = psVar13;
                  psVar1->img_buffer = psVar1->buffer_start + 1;
                }
                if (uVar8 != "JFIF"[lVar14]) {
                  bVar20 = false;
                }
                lVar14 = lVar14 + 1;
              } while (lVar14 != 5);
              iVar18 = uVar11 - 7;
              if (bVar20) {
                z->jfif = 1;
              }
            }
            stbi__skip(z->s,iVar18);
            goto LAB_0012a83e;
          }
          if (m == 0xfe) {
            stbi__g_failure_reason = "bad COM len";
          }
          else {
            stbi__g_failure_reason = "bad APP len";
          }
        }
        else {
          stbi__g_failure_reason = "unknown marker";
        }
        goto LAB_0012a734;
      }
      uVar11 = stbi__get16be(z->s);
      iVar18 = uVar11 - 2;
      if (2 < uVar11) {
        do {
          psVar1 = z->s;
          pbVar2 = psVar1->img_buffer;
          if (pbVar2 < psVar1->img_buffer_end) {
            psVar1->img_buffer = pbVar2 + 1;
            bVar9 = *pbVar2;
LAB_0012a149:
            bVar20 = 0xf < bVar9;
            if ((bVar9 & 0xfffffff0) != 0x10 && bVar20) {
              stbi__g_failure_reason = "bad DQT type";
              goto LAB_0012a734;
            }
            uVar11 = bVar9 & 0xf;
            if (3 < uVar11) {
              stbi__g_failure_reason = "bad DQT table";
              goto LAB_0012a734;
            }
          }
          else {
            if (psVar1->read_from_callbacks != 0) {
              psVar3 = psVar1->buffer_start;
              iVar12 = (*(psVar1->io).read)(psVar1->io_user_data,(char *)psVar3,psVar1->buflen);
              if (iVar12 == 0) {
                psVar1->read_from_callbacks = 0;
                psVar13 = psVar1->buffer_start + 1;
                psVar1->buffer_start[0] = '\0';
                bVar9 = 0;
              }
              else {
                psVar13 = psVar3 + iVar12;
                bVar9 = *psVar3;
              }
              psVar1->img_buffer_end = psVar13;
              psVar1->img_buffer = psVar1->buffer_start + 1;
              goto LAB_0012a149;
            }
            bVar20 = false;
            uVar11 = 0;
          }
          lVar14 = 0;
          do {
            psVar1 = z->s;
            if (bVar20 == false) {
              pbVar2 = psVar1->img_buffer;
              if (pbVar2 < psVar1->img_buffer_end) {
                psVar1->img_buffer = pbVar2 + 1;
                bVar9 = *pbVar2;
              }
              else if (psVar1->read_from_callbacks == 0) {
                bVar9 = 0;
              }
              else {
                psVar3 = psVar1->buffer_start;
                iVar12 = (*(psVar1->io).read)(psVar1->io_user_data,(char *)psVar3,psVar1->buflen);
                if (iVar12 == 0) {
                  psVar1->read_from_callbacks = 0;
                  psVar13 = psVar1->buffer_start + 1;
                  psVar1->buffer_start[0] = '\0';
                  bVar9 = 0;
                }
                else {
                  psVar13 = psVar3 + iVar12;
                  bVar9 = *psVar3;
                }
                psVar1->img_buffer_end = psVar13;
                psVar1->img_buffer = psVar1->buffer_start + 1;
              }
              uVar10 = (ushort)bVar9;
            }
            else {
              iVar12 = stbi__get16be(psVar1);
              uVar10 = (ushort)iVar12;
            }
            *(ushort *)((long)z->dequant[0] + (ulong)""[lVar14] * 2 + (ulong)(uVar11 << 7)) = uVar10
            ;
            lVar14 = lVar14 + 1;
          } while (lVar14 != 0x40);
          iVar18 = iVar18 + (uint)(bVar20 ^ 1) * 0x40 + -0x81;
        } while (0 < iVar18);
      }
    }
    bVar20 = iVar18 == 0;
  }
  else {
    if (m == 0xdd) {
      iVar18 = stbi__get16be(z->s);
      if (iVar18 == 4) {
        iVar18 = stbi__get16be(z->s);
        z->restart_interval = iVar18;
LAB_0012a83e:
        bVar20 = true;
        goto LAB_0012a840;
      }
      stbi__g_failure_reason = "bad DRI len";
    }
    else {
      if (m != 0xff) goto LAB_0012a280;
      stbi__g_failure_reason = "expected marker";
    }
LAB_0012a734:
    bVar20 = false;
  }
LAB_0012a840:
  return (int)bVar20;
}

Assistant:

static int stbi__process_marker(stbi__jpeg *z, int m)
{
   int L;
   switch (m) {
      case STBI__MARKER_none: // no marker found
         return stbi__err("expected marker","Corrupt JPEG");

      case 0xDD: // DRI - specify restart interval
         if (stbi__get16be(z->s) != 4) return stbi__err("bad DRI len","Corrupt JPEG");
         z->restart_interval = stbi__get16be(z->s);
         return 1;

      case 0xDB: // DQT - define quantization table
         L = stbi__get16be(z->s)-2;
         while (L > 0) {
            int q = stbi__get8(z->s);
            int p = q >> 4, sixteen = (p != 0);
            int t = q & 15,i;
            if (p != 0 && p != 1) return stbi__err("bad DQT type","Corrupt JPEG");
            if (t > 3) return stbi__err("bad DQT table","Corrupt JPEG");

            for (i=0; i < 64; ++i)
               z->dequant[t][stbi__jpeg_dezigzag[i]] = (stbi__uint16)(sixteen ? stbi__get16be(z->s) : stbi__get8(z->s));
            L -= (sixteen ? 129 : 65);
         }
         return L==0;

      case 0xC4: // DHT - define huffman table
         L = stbi__get16be(z->s)-2;
         while (L > 0) {
            stbi_uc *v;
            int sizes[16],i,n=0;
            int q = stbi__get8(z->s);
            int tc = q >> 4;
            int th = q & 15;
            if (tc > 1 || th > 3) return stbi__err("bad DHT header","Corrupt JPEG");
            for (i=0; i < 16; ++i) {
               sizes[i] = stbi__get8(z->s);
               n += sizes[i];
            }
            L -= 17;
            if (tc == 0) {
               if (!stbi__build_huffman(z->huff_dc+th, sizes)) return 0;
               v = z->huff_dc[th].values;
            } else {
               if (!stbi__build_huffman(z->huff_ac+th, sizes)) return 0;
               v = z->huff_ac[th].values;
            }
            for (i=0; i < n; ++i)
               v[i] = stbi__get8(z->s);
            if (tc != 0)
               stbi__build_fast_ac(z->fast_ac[th], z->huff_ac + th);
            L -= n;
         }
         return L==0;
   }

   // check for comment block or APP blocks
   if ((m >= 0xE0 && m <= 0xEF) || m == 0xFE) {
      L = stbi__get16be(z->s);
      if (L < 2) {
         if (m == 0xFE)
            return stbi__err("bad COM len","Corrupt JPEG");
         else
            return stbi__err("bad APP len","Corrupt JPEG");
      }
      L -= 2;

      if (m == 0xE0 && L >= 5) { // JFIF APP0 segment
         static const unsigned char tag[5] = {'J','F','I','F','\0'};
         int ok = 1;
         int i;
         for (i=0; i < 5; ++i)
            if (stbi__get8(z->s) != tag[i])
               ok = 0;
         L -= 5;
         if (ok)
            z->jfif = 1;
      } else if (m == 0xEE && L >= 12) { // Adobe APP14 segment
         static const unsigned char tag[6] = {'A','d','o','b','e','\0'};
         int ok = 1;
         int i;
         for (i=0; i < 6; ++i)
            if (stbi__get8(z->s) != tag[i])
               ok = 0;
         L -= 6;
         if (ok) {
            stbi__get8(z->s); // version
            stbi__get16be(z->s); // flags0
            stbi__get16be(z->s); // flags1
            z->app14_color_transform = stbi__get8(z->s); // color transform
            L -= 6;
         }
      }

      stbi__skip(z->s, L);
      return 1;
   }

   return stbi__err("unknown marker","Corrupt JPEG");
}